

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_Perseus.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  DecPOMDPDiscreteInterface *pDVar1;
  NullPlanner *this;
  PerseusBGPlanner *this_00;
  PerseusPOMDPPlanner *this_01;
  ostream *poVar2;
  E *this_02;
  string *psVar3;
  allocator<char> local_2d2;
  PlanningUnitMADPDiscreteParameters local_2d1 [7];
  undefined1 local_2ca;
  BeliefSet B;
  undefined1 local_2a8 [32];
  QAVParameters qavParams;
  Arguments args;
  
  ArgumentHandlers::Arguments::Arguments(&args);
  argp_parse(ArgumentHandlers::theArgpStruc,argc,argv,0,0,&args);
  if (args.infiniteHorizon == false) {
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "Perseus requires an infinite-horizon setting (use --inf)");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    Perseus::ProcessArguments((Arguments *)&qavParams);
    pDVar1 = (DecPOMDPDiscreteInterface *)ArgumentUtils::GetDecPOMDPDiscreteInterfaceFromArgs(&args)
    ;
    if ((args.discount != -1.0) || (NAN(args.discount))) {
      (**(code **)(*(long *)(pDVar1 + *(long *)(*(long *)pDVar1 + -0xb0)) + 0x68))
                (pDVar1 + *(long *)(*(long *)pDVar1 + -0xb0));
    }
    PlanningUnitMADPDiscreteParameters::PlanningUnitMADPDiscreteParameters(local_2d1);
    PlanningUnitMADPDiscreteParameters::SetComputeAll(SUB81(local_2d1,0));
    local_2ca = args.sparse != 0;
    this = (NullPlanner *)operator_new(0x338);
    NullPlanner::NullPlanner(this,999999,pDVar1,local_2d1);
    if (args.backup == POMDP) {
      this_01 = (PerseusPOMDPPlanner *)operator_new(0x200);
      PerseusPOMDPPlanner::PerseusPOMDPPlanner(this_01,(PlanningUnitDecPOMDPDiscrete *)this);
      psVar3 = (string *)(this_01 + 8);
    }
    else {
      if (args.backup != BG) {
        this_02 = (E *)__cxa_allocate_exception(0x28);
        E::E(this_02,"PerseusBackupType is unknown");
        __cxa_throw(this_02,&E::typeinfo,E::~E);
      }
      this_00 = (PerseusBGPlanner *)operator_new(0x218);
      PerseusBGPlanner::PerseusBGPlanner(this_00,(PlanningUnitDecPOMDPDiscrete *)this,&qavParams);
      psVar3 = (string *)(this_00 + 0x18);
    }
    *(int *)(psVar3 + 0x10) = args.verbose;
    if (args.minimumNrIterations != 0) {
      *(int *)(psVar3 + 8) = args.minimumNrIterations;
    }
    if (args.initializeWithZero != 0) {
      psVar3[0x15] = (string)0x1;
    }
    if (args.initializeWithImmediateReward != 0) {
      psVar3[0x14] = (string)0x1;
    }
    Perseus::BackupTypeToString_abi_cxx11_((QAVParameters *)local_2a8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&B,"Perseus"
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
    Perseus::SetIdentification(psVar3);
    std::__cxx11::string::~string((string *)&B);
    std::__cxx11::string::~string((string *)local_2a8);
    std::__cxx11::string::string<std::allocator<char>>((string *)local_2a8,"POMDP",&local_2d2);
    directories::MADPGetResultsFilename
              ((string *)&B,(MultiAgentDecisionProcessInterface *)local_2a8,
               (Arguments *)(pDVar1 + *(long *)(*(long *)pDVar1 + -0x40)));
    Perseus::SetResultsFilename(psVar3);
    std::__cxx11::string::~string((string *)&B);
    std::__cxx11::string::~string((string *)local_2a8);
    if (-1 < args.verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Sampling ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,args.nrBeliefs);
      std::operator<<(poVar2," beliefs");
    }
    std::ostream::flush();
    AlphaVectorPlanning::SampleBeliefs((Arguments *)&B);
    PerseusStationary::SetBeliefSet((vector *)psVar3);
    if (-1 < args.verbose) {
      poVar2 = std::operator<<((ostream *)&std::cout,".");
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    if (args.computeVectorForEachBelief != 0) {
      psVar3[0x8a] = (string)0x1;
    }
    psVar3[0x8b] = (string)0x1;
    (**(code **)(*(long *)psVar3 + 0x68))(psVar3);
    if (-1 < args.verbose) {
      TimedAlgorithm::PrintTimersSummary();
    }
    std::_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_>::
    ~_Vector_base((_Vector_base<JointBeliefInterface_*,_std::allocator<JointBeliefInterface_*>_> *)
                  &B);
    PlanningUnitMADPDiscreteParameters::~PlanningUnitMADPDiscreteParameters(local_2d1);
  }
  std::__cxx11::string::~string((string *)&args.maxplus_updateT);
  return (uint)(args.infiniteHorizon == false);
}

Assistant:

int main(int argc, char **argv)
{
    try
    {

    ArgumentHandlers::Arguments args;
    argp_parse (&ArgumentHandlers::theArgpStruc, argc, argv, 0, 0, &args);

    if(!args.infiniteHorizon)
    {
        cout << "Perseus requires an infinite-horizon setting (use --inf)" << endl;
        return(1);
    }

    size_t horizon;
    if(args.infiniteHorizon)
        horizon=MAXHORIZON;
    else
        horizon=args.horizon;
    
    QAVParameters qavParams=Perseus::ProcessArguments(args);

    DecPOMDPDiscreteInterface* decpomdp;
    decpomdp = GetDecPOMDPDiscreteInterfaceFromArgs(args);

    /*
    if(args.isTOI)
    {
        // necessary for running Perseus
        if(args.sparse)
        {
            cout << "Creating centralized sparse models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedSparseModels();
            cout << "." << endl;
        }
        else
        {
            cout << "Creating centralized full models"; cout.flush();
            dynamic_cast<TOIDecPOMDPDiscrete*>(decpomdp)->CreateCentralizedFullModels();
            cout << "." << endl;
        }
    }*/

    if(args.discount!=-1)
        decpomdp->SetDiscount(args.discount);

    PlanningUnitMADPDiscreteParameters params;
    params.SetComputeAll(false);
    if(args.sparse)
        params.SetUseSparseJointBeliefs(true);
    else
        params.SetUseSparseJointBeliefs(false);
    NullPlanner *np=new NullPlanner(horizon, decpomdp, &params);
    
    Perseus *P;
    PerseusStationary *PS=0;
    switch(args.backup)
    {
    case POMDP:
        PS=new PerseusPOMDPPlanner(np);
        break;
    case BG:
        PS=new PerseusBGPlanner(np,qavParams);
        break;
    default:
        throw(E("PerseusBackupType is unknown"));
    }
    P=PS;

    P->SetVerbose(args.verbose);
    if(args.minimumNrIterations)
        P->SetMinimumNumberOfIterations(args.minimumNrIterations);
    if(args.initializeWithZero)
        P->SetInitializeWithZero(true);
    if(args.initializeWithImmediateReward)
        P->SetInitializeWithImmediateReward(true);
    P->SetIdentification("Perseus" + Perseus::BackupTypeToString(qavParams));
    P->SetResultsFilename(directories::MADPGetResultsFilename("POMDP",
                                                              *decpomdp,args));
    if(args.verbose >= 0)
        cout << "Sampling " << args.nrBeliefs << " beliefs"; cout.flush();

    BeliefSet B=P->SampleBeliefs(args);

    PS->SetBeliefSet(B);

    if(args.verbose >= 0)
        cout << "." << endl;

    if(args.computeVectorForEachBelief)
        P->SetComputeVectorForEachBelief(true);
    P->SetDryrun(true);
    P->Plan();

    if(args.verbose >= 0)
        P->PrintTimersSummary();
    }
    catch(E& e){ e.Print(); }

    return(0);
}